

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

RTPRawPacket * __thiscall jrtplib::RTPFakeTransmitter::GetNextPacket(RTPFakeTransmitter *this)

{
  bool bVar1;
  reference ppRVar2;
  _List_iterator<jrtplib::RTPRawPacket_*> local_28;
  RTPFakeTransmitter *local_20;
  RTPRawPacket *p;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local = (RTPFakeTransmitter *)0x0;
  }
  else if ((this->created & 1U) == 0) {
    this_local = (RTPFakeTransmitter *)0x0;
  }
  else {
    p = (RTPRawPacket *)this;
    bVar1 = std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
            empty(&this->rawpacketlist);
    if (bVar1) {
      this_local = (RTPFakeTransmitter *)0x0;
    }
    else {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
           begin(&this->rawpacketlist);
      ppRVar2 = std::_List_iterator<jrtplib::RTPRawPacket_*>::operator*(&local_28);
      local_20 = (RTPFakeTransmitter *)*ppRVar2;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      pop_front(&this->rawpacketlist);
      this_local = local_20;
    }
  }
  return (RTPRawPacket *)this_local;
}

Assistant:

RTPRawPacket *RTPFakeTransmitter::GetNextPacket()
{
	if (!init)
		return 0;
	
	MAINMUTEX_LOCK
	
	RTPRawPacket *p;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return 0;
	}
	if (rawpacketlist.empty())
	{
		MAINMUTEX_UNLOCK
		return 0;
	}

	p = *(rawpacketlist.begin());
	rawpacketlist.pop_front();

	MAINMUTEX_UNLOCK
	return p;
}